

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndComboPreview(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImDrawCmd *pIVar3;
  ImVec2 IVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *this;
  ImDrawCmd *pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiContext *pIVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pIVar11 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  fVar15 = (GImGui->ComboPreviewData).PreviewRect.Max.x;
  pIVar1 = &(pIVar5->DC).CursorMaxPos;
  if ((pIVar1->x <= fVar15 && fVar15 != pIVar1->x) &&
     (fVar15 = (GImGui->ComboPreviewData).PreviewRect.Max.y, pfVar2 = &(pIVar5->DC).CursorMaxPos.y,
     *pfVar2 <= fVar15 && fVar15 != *pfVar2)) {
    this = pIVar5->DrawList;
    lVar12 = (long)(this->CmdBuffer).Size;
    if (1 < lVar12) {
      pIVar6 = (this->CmdBuffer).Data;
      pIVar3 = pIVar6 + lVar12 + -2;
      uVar7 = (pIVar3->ClipRect).x;
      uVar8 = (pIVar3->ClipRect).y;
      uVar9 = (pIVar3->ClipRect).z;
      uVar10 = (pIVar3->ClipRect).w;
      pIVar6 = pIVar6 + lVar12 + -1;
      (pIVar6->ClipRect).x = (float)uVar7;
      (pIVar6->ClipRect).y = (float)uVar8;
      (pIVar6->ClipRect).z = (float)uVar9;
      (pIVar6->ClipRect).w = (float)uVar10;
      (this->_CmdHeader).ClipRect.x = (float)uVar7;
      (this->_CmdHeader).ClipRect.y = (float)uVar8;
      (this->_CmdHeader).ClipRect.z = (float)uVar9;
      (this->_CmdHeader).ClipRect.w = (float)uVar10;
      ImDrawList::_TryMergeDrawCmds(this);
    }
  }
  PopClipRect();
  (pIVar5->DC).CursorPos = (pIVar11->ComboPreviewData).BackupCursorPos;
  IVar4 = (pIVar5->DC).CursorMaxPos;
  fVar15 = IVar4.x;
  fVar16 = IVar4.y;
  IVar4 = (pIVar11->ComboPreviewData).BackupCursorMaxPos;
  fVar17 = IVar4.x;
  fVar18 = IVar4.y;
  uVar13 = -(uint)(fVar17 <= fVar15);
  uVar14 = -(uint)(fVar18 <= fVar16);
  (pIVar5->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar14 & (uint)fVar18,~uVar13 & (uint)fVar17) |
               CONCAT44((uint)fVar16 & uVar14,(uint)fVar15 & uVar13));
  (pIVar5->DC).CursorPosPrevLine = (pIVar11->ComboPreviewData).BackupCursorPosPrevLine;
  (pIVar5->DC).PrevLineTextBaseOffset = (pIVar11->ComboPreviewData).BackupPrevLineTextBaseOffset;
  (pIVar5->DC).LayoutType = (pIVar11->ComboPreviewData).BackupLayout;
  (pIVar5->DC).IsSameLine = false;
  (pIVar11->ComboPreviewData).PreviewRect.Min.x = 0.0;
  (pIVar11->ComboPreviewData).PreviewRect.Min.y = 0.0;
  (pIVar11->ComboPreviewData).PreviewRect.Max.x = 0.0;
  (pIVar11->ComboPreviewData).PreviewRect.Max.y = 0.0;
  return;
}

Assistant:

void ImGui::EndComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    // FIXME: Using CursorMaxPos approximation instead of correct AABB which we will store in ImDrawCmd in the future
    ImDrawList* draw_list = window->DrawList;
    if (window->DC.CursorMaxPos.x < preview_data->PreviewRect.Max.x && window->DC.CursorMaxPos.y < preview_data->PreviewRect.Max.y)
        if (draw_list->CmdBuffer.Size > 1) // Unlikely case that the PushClipRect() didn't create a command
        {
            draw_list->_CmdHeader.ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 2].ClipRect;
            draw_list->_TryMergeDrawCmds();
        }
    PopClipRect();
    window->DC.CursorPos = preview_data->BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, preview_data->BackupCursorMaxPos);
    window->DC.CursorPosPrevLine = preview_data->BackupCursorPosPrevLine;
    window->DC.PrevLineTextBaseOffset = preview_data->BackupPrevLineTextBaseOffset;
    window->DC.LayoutType = preview_data->BackupLayout;
    window->DC.IsSameLine = false;
    preview_data->PreviewRect = ImRect();
}